

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

int Dau_DecPerform(word *pInit,int nVars,uint uSet)

{
  int *pSched;
  ulong uVar1;
  size_t __n;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uMaskS;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int nVarsF;
  int nVarsS;
  int nVarsU;
  ulong local_8858;
  word *local_8850;
  int pPermC [16];
  int P2V [16];
  int V2P [16];
  int pPermD [16];
  word p [1024];
  word pDec [1024];
  word pComp [1024];
  char pDsdD [5000];
  char pDsdC [5000];
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x30b,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  uVar1 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar1 = 1;
  }
  local_8850 = pInit;
  memcpy(p,pInit,uVar1 << 3);
  Dau_DecSortSet(uSet,nVars,&nVarsU,&nVarsS,&nVarsF);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < nVars) {
    uVar2 = (ulong)(uint)nVars;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    P2V[uVar1] = (int)uVar1;
    V2P[uVar1] = (int)uVar1;
  }
  bVar4 = 0;
  iVar7 = 0;
  uVar1 = 0;
  for (iVar5 = 0; iVar8 = (int)uVar2, iVar8 != iVar5; iVar5 = iVar5 + 1) {
    if ((uSet >> (bVar4 & 0x1f) & 3) == 0) {
      Abc_TtMoveVar(p,nVars,V2P,P2V,iVar5,iVar7);
      iVar8 = (int)uVar1;
      uVar1 = (ulong)(iVar8 + 1);
      pPermC[iVar8] = iVar5;
      iVar7 = iVar7 + 1;
    }
    bVar4 = bVar4 + 2;
  }
  bVar4 = 0;
  iVar5 = 0;
  while( true ) {
    iVar6 = (int)uVar1;
    if (iVar8 == iVar5) break;
    if ((~(uSet >> (bVar4 & 0x1f)) & 3) == 0) {
      Abc_TtMoveVar(p,nVars,V2P,P2V,iVar5,iVar7);
      uVar1 = (ulong)(iVar6 + 1);
      pPermC[iVar6] = iVar5;
      iVar7 = iVar7 + 1;
    }
    iVar5 = iVar5 + 1;
    bVar4 = bVar4 + 2;
  }
  pPermC[iVar6] = nVars;
  bVar4 = 0;
  iVar5 = 0;
  local_8858 = uVar1;
  for (iVar6 = 0; lVar9 = (long)iVar5, iVar8 != iVar6; iVar6 = iVar6 + 1) {
    if ((uSet >> (bVar4 & 0x1f) & 3) == 1) {
      Abc_TtMoveVar(p,nVars,V2P,P2V,iVar6,iVar7);
      iVar5 = iVar5 + 1;
      pPermD[lVar9] = iVar6;
      uVar1 = local_8858;
      iVar7 = iVar7 + 1;
    }
    bVar4 = bVar4 + 2;
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0 < nVarsS) {
    uVar2 = (ulong)(uint)nVarsS;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pPermD[lVar9 + uVar3] = pPermC[(long)nVarsF + uVar3];
  }
  if ((int)uVar3 + ((iVar5 - nVarsS) - nVarsU) != 0) {
    __assert_fail("nVarsD == nVarsU + nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,799,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if ((int)uVar1 != nVarsF + nVarsS) {
    __assert_fail("nVarsC == nVarsF + nVarsS + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,800,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if (iVar7 != nVars) {
    __assert_fail("i == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x321,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  iVar7 = iVar5 + (int)uVar3;
  pSched = Extra_GreyCodeSchedule(iVar7);
  __n = 8;
  if (6 < (long)(lVar9 + uVar3)) {
    __n = (long)(1 << (((char)iVar5 + (char)uVar3) - 6U & 0x1f)) << 3;
  }
  memset(pDec,0,__n);
  iVar8 = (int)local_8858;
  iVar5 = 1 << ((char)local_8858 - 5U & 0x1f);
  if (iVar8 < 6) {
    iVar5 = 1;
  }
  memset(pComp,0,(long)iVar5 << 3);
  uMaskS = 0xffffffff >> (-(char)nVarsS & 0x1fU);
  if (nVarsS == 0) {
    uMaskS = 0;
  }
  iVar5 = Dau_DecCheckSetTop(p,nVars,nVarsF,iVar7,nVarsS,uMaskS,pSched,pDec,pComp);
  free(pSched);
  if (iVar5 == 0) {
    puts("  Decomposition does not exist");
  }
  else {
    iVar8 = iVar8 + 1;
    Dau_DsdDecompose(pComp,iVar8,0,1,pDsdC);
    Dau_DsdDecompose(pDec,iVar7,0,1,pDsdD);
    Dau_DecVarReplace(pDsdD,pPermD,iVar7);
    Dau_DecVarReplace(pDsdC,pPermC,iVar8);
    printf("     ");
    printf("%3d : ",0);
    printf("%24s  ",pDsdD);
    printf("%24s  ",pDsdC);
    Dau_DecVerify(local_8850,nVars,pDsdC,pDsdD);
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int Dau_DecPerform( word * pInit, int nVars, unsigned uSet )
{
    word p[1<<10], pDec[1<<10], pComp[1<<10]; // at most 2^10 words
    char pDsdC[5000], pDsdD[5000];  // at most 2^12 hex digits
    int nVarsU, nVarsS, nVarsF, nVarsC = 0, nVarsD = 0;
    int V2P[16], P2V[16], pPermC[16], pPermD[16], * pSched;
    int v, i, status, ResC, ResD;
    int nWords = Abc_TtWordNum(nVars);
    assert( nVars <= 16 );
    // backup the function
    memcpy( p, pInit, sizeof(word) * nWords );
    // get variable numbers
    Dau_DecSortSet( uSet, nVars, &nVarsU, &nVarsS, &nVarsF );
    // permute function and order variables
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    for ( i = v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 0 ) // free first
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 3 ) // share second
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    pPermC[nVarsC++] = nVars;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 1 ) // unique last
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermD[nVarsD++] = v;
    for ( v = 0; v < nVarsS; v++ )
        pPermD[nVarsD++] = pPermC[nVarsF+v];
    assert( nVarsD == nVarsU + nVarsS );
    assert( nVarsC == nVarsF + nVarsS + 1 );
    assert( i == nVars );
    // decompose
    pSched = Extra_GreyCodeSchedule( nVarsU + nVarsS );
    memset( pDec, 0, sizeof(word) * Abc_TtWordNum(nVarsD) );
    memset( pComp, 0, sizeof(word) * Abc_TtWordNum(nVarsC) );
    status = Dau_DecCheckSetTop( p, nVars, nVarsF, nVarsU + nVarsS, nVarsS, nVarsS ? Abc_InfoMask(nVarsS) : 0, pSched, pDec, pComp );
    ABC_FREE( pSched );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
//    Dau_DsdPrintFromTruth( stdout, pC, nVars+1 ); //printf( "\n" );
//    Dau_DsdPrintFromTruth( stdout, pD, nVars ); //printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pComp, 6 ); printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pDec, 6 );  printf( "\n" );
    // decompose
    ResC = Dau_DsdDecompose( pComp, nVarsC, 0, 1, pDsdC );
    ResD = Dau_DsdDecompose( pDec, nVarsD, 0, 1, pDsdD );
    // replace variables
    Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
    Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
    // report
    printf( "     " );
    printf( "%3d : ", 0 );
    printf( "%24s  ", pDsdD );
    printf( "%24s  ", pDsdC );
    Dau_DecVerify( pInit, nVars, pDsdC, pDsdD );
    return 1;
}